

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.cc
# Opt level: O3

void re2c::prtCh(ostream *o,uint32_t c)

{
  target_t tVar1;
  undefined8 in_RAX;
  opt_t *poVar2;
  char *pcVar3;
  ulong uVar4;
  char *pcVar5;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  poVar2 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
  tVar1 = poVar2->target;
  if ((int)c < 0x22) {
    switch(c) {
    case 7:
      uVar4 = (ulong)(tVar1 == DOT);
      pcVar3 = "\\\\a";
      pcVar5 = "\\a";
      break;
    case 8:
      uVar4 = (ulong)(tVar1 == DOT);
      pcVar3 = "\\\\b";
      pcVar5 = "\\b";
      break;
    case 9:
      uVar4 = (ulong)(tVar1 == DOT);
      pcVar3 = "\\\\t";
      pcVar5 = "\\t";
      break;
    case 10:
      uVar4 = (ulong)(tVar1 == DOT);
      pcVar3 = "\\\\n";
      pcVar5 = "\\n";
      break;
    case 0xb:
      uVar4 = (ulong)(tVar1 == DOT);
      pcVar3 = "\\\\v";
      pcVar5 = "\\v";
      break;
    case 0xc:
      uVar4 = (ulong)(tVar1 == DOT);
      pcVar3 = "\\\\f";
      pcVar5 = "\\f";
      break;
    case 0xd:
      uVar4 = (ulong)(tVar1 == DOT);
      pcVar3 = "\\\\r";
      pcVar5 = "\\r";
      break;
    default:
switchD_00125a73_default:
      uStack_18 = CONCAT17((char)c,(undefined7)uStack_18);
      std::__ostream_insert<char,std::char_traits<char>>(o,(char *)((long)&uStack_18 + 7),1);
      return;
    }
    if (tVar1 == DOT) {
      pcVar5 = pcVar3;
    }
    uVar4 = uVar4 | 2;
  }
  else {
    if (c == 0x22) {
      uVar4 = (ulong)(tVar1 == DOT);
      pcVar5 = "\"";
      if (tVar1 == DOT) {
        pcVar5 = "\\\"";
      }
    }
    else {
      if (c == 0x5c) {
        pcVar5 = "\\\\";
        uVar4 = 2;
        goto LAB_00125ba8;
      }
      if (c != 0x27) goto switchD_00125a73_default;
      pcVar5 = "\\\'";
      if (tVar1 == DOT) {
        pcVar5 = "\'";
      }
      uVar4 = (ulong)(tVar1 != DOT);
    }
    uVar4 = uVar4 + 1;
  }
LAB_00125ba8:
  std::__ostream_insert<char,std::char_traits<char>>(o,pcVar5,uVar4);
  return;
}

Assistant:

void prtCh(std::ostream& o, uint32_t c)
{
	const bool dot = opts->target == opt_t::DOT;

	switch (c)
	{
		case '\'':
		o << (dot ? "'" : "\\'");
		break;

		case '"':
		o << (dot ? "\\\"" : "\"");
		break;

		case '\n':
		o << (dot ? "\\\\n" : "\\n");
		break;

		case '\t':
		o << (dot ? "\\\\t" : "\\t");
		break;

		case '\v':
		o << (dot ? "\\\\v" : "\\v");
		break;

		case '\b':
		o << (dot ? "\\\\b" : "\\b");
		break;

		case '\r':
		o << (dot ? "\\\\r" : "\\r");
		break;

		case '\f':
		o << (dot ? "\\\\f" : "\\f");
		break;

		case '\a':
		o << (dot ? "\\\\a" :"\\a");
		break;

		case '\\':
		o << "\\\\"; // both .dot and C/C++ code expect "\\"
		break;

		default:
		o << static_cast<char> (c);
		break;
	}
}